

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2furthest_edge_query.cc
# Opt level: O0

bool __thiscall
S2FurthestEdgeQuery::IsConservativeDistanceGreaterOrEqual
          (S2FurthestEdgeQuery *this,Target *target,S1ChordAngle limit)

{
  int32 iVar1;
  Result local_58;
  double local_48;
  double local_40;
  undefined1 local_38 [8];
  Options tmp_options;
  Target *target_local;
  S2FurthestEdgeQuery *this_local;
  S1ChordAngle limit_local;
  
  local_38 = (undefined1  [8])(this->options_).super_Options.max_distance_.distance_.length2_;
  tmp_options.super_Options.max_distance_.distance_.length2_ =
       (S1ChordAngle)(this->options_).super_Options.max_error_.length2_;
  tmp_options.super_Options.max_error_.length2_ =
       *(double *)&(this->options_).super_Options.max_results_;
  tmp_options.super_Options._16_8_ = target;
  S2ClosestEdgeQueryBase<S2MaxDistance>::Options::set_max_results((Options *)local_38,1);
  local_40 = limit.length2_;
  Options::set_conservative_min_distance((Options *)local_38,limit);
  local_48 = (double)S1ChordAngle::Straight();
  Options::set_max_error((Options *)local_38,(S1ChordAngle)local_48);
  local_58 = S2ClosestEdgeQueryBase<S2MaxDistance>::FindClosestEdge
                       (&this->base_,(Target *)tmp_options.super_Options._16_8_,(Options *)local_38)
  ;
  iVar1 = S2ClosestEdgeQueryBase<S2MaxDistance>::Result::shape_id(&local_58);
  return -1 < iVar1;
}

Assistant:

bool S2FurthestEdgeQuery::IsConservativeDistanceGreaterOrEqual(
    Target* target, S1ChordAngle limit) {
  static_assert(sizeof(Options) <= 32, "Consider not copying Options here");
  Options tmp_options = options_;
  tmp_options.set_max_results(1);
  tmp_options.set_conservative_min_distance(limit);
  tmp_options.set_max_error(S1ChordAngle::Straight());
  return base_.FindClosestEdge(target, tmp_options).shape_id() >= 0;
}